

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

art_ref_t art_node_erase(art_t *art,art_inner_node_t *node,art_typecode_t typecode,
                        art_key_chunk_t key_chunk)

{
  byte *pbVar1;
  art_node4_t *node_00;
  art_node16_t *node_01;
  uint8_t uVar2;
  short sVar3;
  art_node_t *paVar4;
  art_ref_t child;
  art_node_t *paVar5;
  byte bVar6;
  uint64_t uVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  art_typecode_t typecode_1;
  size_t sVar13;
  long lVar14;
  
  switch((int)CONCAT71(in_register_00000011,typecode)) {
  case 2:
    bVar6 = node[1].prefix_size;
    uVar11 = 0xffffffff;
    uVar8 = 0xffffffff;
    if ((ulong)bVar6 != 0) {
      uVar10 = 0;
      do {
        if (node[1].prefix[uVar10] == key_chunk) {
          uVar11 = uVar10 & 0xffffffff;
        }
        uVar8 = (uint)uVar11;
        uVar10 = uVar10 + 1;
      } while (bVar6 != uVar10);
    }
    if (uVar8 != 0xffffffff) {
      if (bVar6 == 2) {
        uVar10 = (ulong)(uVar8 & 0xff) ^ 1;
        uVar11 = *(ulong *)((long)node + uVar10 * 8 + 0x10);
        if ((uVar11 & 0xff) != 1) {
          uVar2 = node[1].prefix[uVar10];
          uVar10 = (ulong)(uint)((int)(uVar11 & 0xff) << 3);
          lVar14 = *(long *)((long)art->nodes + uVar10);
          lVar9 = (uVar11 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar10);
          lVar12 = lVar14 + lVar9;
          pbVar1 = (byte *)(lVar14 + lVar9);
          memmove((void *)((ulong)node->prefix_size + lVar12 + 2),pbVar1 + 1,(ulong)*pbVar1);
          memcpy(pbVar1 + 1,node->prefix,(ulong)node->prefix_size);
          *(uint8_t *)((ulong)node->prefix_size + 1 + lVar12) = uVar2;
          *pbVar1 = node->prefix_size + *pbVar1 + 1;
        }
        paVar4 = art->nodes[2];
        *(uint64_t *)node = art->first_free[2];
        art->first_free[2] = ((long)node - (long)paVar4 >> 4) * -0x5555555555555555;
        return uVar11;
      }
      lVar12 = (long)(int)uVar8;
      sVar13 = (size_t)(int)(~uVar8 + (uint)bVar6);
      memmove(node[1].prefix + lVar12,node[1].prefix + lVar12 + 1,sVar13);
      memmove((void *)((long)node + lVar12 * 8 + 0x10),(void *)((long)node + lVar12 * 8 + 0x18),
              sVar13 << 3);
      node[1].prefix_size = node[1].prefix_size + 0xff;
    }
    uVar11 = (long)node - (long)art->nodes[2];
    break;
  case 3:
    uVar11 = (ulong)node[1].prefix_size;
    if (uVar11 != 0) {
      sVar13 = uVar11 * 8;
      lVar12 = 1 - uVar11;
      lVar14 = 4;
      do {
        sVar13 = sVar13 - 8;
        if (node->prefix[lVar14 + 2] == key_chunk) {
          memmove(node->prefix + lVar14 + 2,node->prefix + lVar14 + 3,-lVar12);
          memmove((void *)((long)node + lVar14 * 8 + -8),(void *)((long)node + lVar14 * 8),sVar13);
          node[1].prefix_size = node[1].prefix_size + 0xff;
          break;
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 1);
    }
    if (4 < node[1].prefix_size) {
      uVar11 = (long)node - (long)art->nodes[3];
LAB_001068b4:
      return (uVar11 >> 3) * -0x5e50d79435e50000 | 3;
    }
    bVar6 = node->prefix_size;
    uVar7 = art_allocate_index(art,'\x02');
    node_00 = (art_node4_t *)((long)art->nodes[2] + uVar7 * 0x30);
    pbVar1 = (byte *)((long)art->nodes[2] + uVar7 * 0x30);
    *pbVar1 = bVar6;
    memcpy(pbVar1 + 1,node->prefix,(ulong)bVar6);
    pbVar1[6] = 0;
    lVar12 = 3;
    do {
      art_node4_insert(art,node_00,*(art_ref_t *)((long)node + lVar12 * 8),node->prefix[lVar12 + 3])
      ;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 7);
    paVar4 = art->nodes[3];
    *(uint64_t *)node = art->first_free[3];
    art->first_free[3] = ((long)node - (long)paVar4 >> 3) * -0x79435e50d79435e5;
    uVar11 = (long)node_00 - (long)art->nodes[2];
    break;
  case 4:
    bVar6 = node[2].prefix[(ulong)key_chunk + 3];
    if (bVar6 != 0x30) {
      node[2].prefix[(ulong)key_chunk + 3] = '0';
      *(ulong *)(node[1].prefix + 1) = *(ulong *)(node[1].prefix + 1) | 1L << (bVar6 & 0x3f);
      bVar6 = node[1].prefix_size - 1;
      node[1].prefix_size = bVar6;
      if (bVar6 < 0x11) {
        bVar6 = node->prefix_size;
        uVar7 = art_allocate_index(art,'\x03');
        node_01 = (art_node16_t *)((long)art->nodes[3] + uVar7 * 0x98);
        pbVar1 = (byte *)((long)art->nodes[3] + uVar7 * 0x98);
        *pbVar1 = bVar6;
        memcpy(pbVar1 + 1,node->prefix,(ulong)bVar6);
        pbVar1[6] = 0;
        lVar12 = 0;
        do {
          if ((ulong)node[2].prefix[lVar12 + 3] != 0x30) {
            art_node16_insert(art,node_01,
                              *(art_ref_t *)
                               ((long)node + (ulong)node[2].prefix[lVar12 + 3] * 8 + 0x110),
                              (uint8_t)lVar12);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x100);
        paVar4 = art->nodes[4];
        *(uint64_t *)node = art->first_free[4];
        art->first_free[4] = ((long)node - (long)paVar4 >> 4) * -0x7063e7063e7063e7;
        uVar11 = (long)node_01 - (long)art->nodes[3];
        goto LAB_001068b4;
      }
    }
    uVar11 = (long)node - (long)art->nodes[4];
    goto LAB_0010669d;
  case 5:
    *(undefined8 *)((long)node + (ulong)key_chunk * 8 + 8) = 0;
    sVar3 = *(short *)(node + 1);
    *(ushort *)(node + 1) = sVar3 - 1U;
    if (0x30 < (ushort)(sVar3 - 1U)) {
      return ((ulong)((long)node - (long)art->nodes[5]) >> 3) * -0xff00ff00ff0000 | 5;
    }
    bVar6 = node->prefix_size;
    uVar7 = art_allocate_index(art,'\x04');
    paVar4 = art->nodes[4];
    lVar12 = uVar7 * 0x290;
    pbVar1 = (byte *)((long)paVar4 + lVar12);
    *pbVar1 = bVar6;
    memcpy(pbVar1 + 1,node->prefix,(ulong)bVar6);
    pbVar1[6] = 0;
    pbVar1[8] = 0xff;
    pbVar1[9] = 0xff;
    pbVar1[10] = 0xff;
    pbVar1[0xb] = 0xff;
    pbVar1[0xc] = 0xff;
    pbVar1[0xd] = 0xff;
    pbVar1[0xe] = 0;
    pbVar1[0xf] = 0;
    memset((void *)((long)paVar4 + lVar12 + 0x10),0x30,0x100);
    lVar14 = 0;
    do {
      child = *(art_ref_t *)((long)node + lVar14 * 8 + 8);
      if (child != 0) {
        art_node48_insert(art,(art_node48_t *)((long)paVar4 + lVar12),child,(uint8_t)lVar14);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x100);
    paVar5 = art->nodes[5];
    *(uint64_t *)node = art->first_free[5];
    art->first_free[5] = ((long)node - (long)paVar5 >> 3) * -0xff00ff00ff00ff;
    uVar11 = ((long)paVar4 + lVar12) - (long)art->nodes[4];
LAB_0010669d:
    return (uVar11 >> 4) * 0x18f9c18f9c190000 | 4;
  default:
    return 0;
  }
  return (uVar11 >> 4) * -0x5555555555550000 | 2;
}

Assistant:

static art_ref_t art_node_erase(art_t *art, art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_erase(art, (art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_erase(art, (art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_erase(art, (art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_erase(art, (art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}